

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::reDim(SPxSolverBase<double> *this)

{
  uint uVar1;
  UnitVectorBase<double> *pUVar2;
  uint newsize;
  UnitVectorBase<double> local_50;
  
  newsize = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
            thenum;
  uVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
          thenum;
  if ((int)newsize < (int)uVar1) {
    newsize = uVar1;
  }
  if ((int)((ulong)((long)(this->unitVecs).data.
                          super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->unitVecs).data.
                         super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 5) < (int)newsize) {
    Array<soplex::UnitVectorBase<double>_>::reSize(&this->unitVecs,newsize);
    while (0 < (int)newsize) {
      newsize = newsize - 1;
      UnitVectorBase<double>::UnitVectorBase(&local_50,newsize);
      pUVar2 = (this->unitVecs).data.
               super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start + newsize;
      if (pUVar2 != &local_50) {
        (pUVar2->themem).idx = local_50.themem.idx;
        (pUVar2->themem).val = local_50.themem.val;
        (pUVar2->super_SVectorBase<double>).memused = 1;
      }
    }
  }
  if (this->initialized == true) {
    VectorBase<double>::reDim(this->theFrhs,(this->thecovectors->set).thenum,true);
    UpdateVector<double>::reDim(this->theFvec,(this->thecovectors->set).thenum);
    UpdateVector<double>::reDim(this->thePvec,(this->thevectors->set).thenum);
    VectorBase<double>::reDim(this->theCoPrhs,(this->thecovectors->set).thenum,true);
    UpdateVector<double>::reDim(this->theCoPvec,(this->thecovectors->set).thenum);
    VectorBase<double>::reDim(&this->theTest,(this->thevectors->set).thenum,true);
    VectorBase<double>::reDim(&this->theCoTest,(this->thecovectors->set).thenum,true);
    VectorBase<double>::reDim
              (&this->theURbound,
               (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               set.thenum,true);
    VectorBase<double>::reDim
              (&this->theLRbound,
               (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               set.thenum,true);
    VectorBase<double>::reDim
              (&this->theUCbound,
               (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
               set.thenum,true);
    VectorBase<double>::reDim
              (&this->theLCbound,
               (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
               set.thenum,true);
    VectorBase<double>::reDim(&this->theUBbound,(this->thecovectors->set).thenum,true);
    VectorBase<double>::reDim(&this->theLBbound,(this->thecovectors->set).thenum,true);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::reDim()
   {

      int newsize = SPxLPBase<R>::nCols() > SPxLPBase<R>::nRows() ? SPxLPBase<R>::nCols() :
                    SPxLPBase<R>::nRows();

      if(newsize > unitVecs.size())
      {
         unitVecs.reSize(newsize);

         while(newsize-- > 0)
            unitVecs[newsize] = UnitVectorBase<R>(newsize);
      }

      if(isInitialized())
      {
         theFrhs->reDim(dim());
         theFvec->reDim(dim());
         thePvec->reDim(coDim());

         theCoPrhs->reDim(dim());
         theCoPvec->reDim(dim());

         theTest.reDim(coDim());
         theCoTest.reDim(dim());

         theURbound.reDim(SPxLPBase<R>::nRows());
         theLRbound.reDim(SPxLPBase<R>::nRows());
         theUCbound.reDim(SPxLPBase<R>::nCols());
         theLCbound.reDim(SPxLPBase<R>::nCols());
         theUBbound.reDim(dim());
         theLBbound.reDim(dim());
      }
   }